

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

_Bool extents_init(tsdn_t *tsdn,extents_t *extents,extent_state_t state,_Bool delay_coalesce)

{
  _Bool _Var1;
  
  _Var1 = malloc_mutex_init(&extents->mtx,"extents",0xf,malloc_mutex_rank_exclusive);
  if (!_Var1) {
    memset(extents->heaps,0,0x640);
    bitmap_init(extents->bitmap,&extents_bitmap_info,true);
    (extents->lru).qlh_first = (extent_t *)0x0;
    (extents->npages).repr = 0;
    extents->state = state;
    extents->delay_coalesce = delay_coalesce;
  }
  return _Var1;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}